

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx.cpp
# Opt level: O3

int __thiscall ncnn::LSTM_x86_avx::create_pipeline_int8(LSTM_x86_avx *this,Option *opt)

{
  Mat *weight_xc;
  Mat *weight_xc_int8_scales;
  Mat *weight_hc;
  Mat *weight_hc_int8_scales;
  Mat *bias_c;
  Mat *this_00;
  Mat *this_01;
  Mat *this_02;
  long lVar1;
  uint _h;
  int num_output;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  void *pvVar10;
  void *pvVar11;
  void *pvVar12;
  void *pvVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  undefined1 *puVar24;
  long lVar25;
  undefined4 *puVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  void *pvVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  void *pvVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  ulong uVar41;
  void *pvVar42;
  uint uVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  uint _c;
  void *pvVar47;
  int iVar48;
  long lVar49;
  uint uVar50;
  void *pvVar51;
  void *local_198;
  void *local_190;
  void *local_188;
  ulong local_158;
  void *local_140;
  long local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  
  _c = ((this->super_LSTM).direction == 2) + 1;
  uVar18 = (long)(this->super_LSTM).weight_data_size / (long)(int)_c;
  _h = (this->super_LSTM).hidden_size;
  uVar21 = (ulong)_h;
  iVar16 = (int)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                (long)(int)_h);
  iVar48 = iVar16 + 3;
  if (-1 < iVar16) {
    iVar48 = iVar16;
  }
  iVar48 = iVar48 >> 2;
  weight_xc = &(this->super_LSTM).weight_xc_data;
  weight_xc_int8_scales = &(this->super_LSTM).weight_xc_data_int8_scales;
  weight_hc = &(this->super_LSTM).weight_hc_data;
  weight_hc_int8_scales = &(this->super_LSTM).weight_hc_data_int8_scales;
  bias_c = &(this->super_LSTM).bias_c_data;
  this_00 = &this->weight_data_tm;
  this_01 = &this->weight_data_tm_int8_descales;
  this_02 = &this->bias_c_data_packed;
  num_output = (this->super_LSTM).num_output;
  iVar17 = cpu_support_x86_avx_vnni();
  if (iVar17 == 0) {
    iVar17 = cpu_support_x86_avx2();
    if (iVar17 == 0) {
      Mat::create(this_00,num_output + iVar48,_h,_c,4,4,(Allocator *)0x0);
      Mat::create(this_01,8,_h,_c,4,(Allocator *)0x0);
      local_158 = 0;
      Mat::create(this_02,_h,1,_c,0x10,4,(Allocator *)0x0);
      uVar18 = (ulong)(_h * 2);
      uVar19 = (ulong)(_h * 3);
      do {
        if (0 < (int)_h) {
          pvVar5 = (this->super_LSTM).weight_xc_data.data;
          lVar29 = (this->super_LSTM).weight_xc_data.cstep * local_158;
          sVar6 = (this->super_LSTM).weight_xc_data.elemsize;
          lVar25 = (long)(this->super_LSTM).weight_xc_data.w;
          lVar32 = sVar6 * lVar25;
          pvVar3 = (void *)((long)pvVar5 + lVar29 * sVar6);
          sVar7 = (this->super_LSTM).bias_c_data.elemsize;
          lVar49 = (this->super_LSTM).bias_c_data.cstep * local_158 * sVar7;
          sVar8 = (this->weight_data_tm).cstep;
          sVar9 = (this->weight_data_tm_int8_descales).elemsize;
          lVar30 = (this->weight_data_tm_int8_descales).cstep * local_158 * sVar9;
          lVar22 = (long)(this->super_LSTM).bias_c_data.w * sVar7;
          iVar17 = (this->weight_data_tm_int8_descales).w;
          sVar7 = (this->weight_data_tm).elemsize;
          lVar33 = (uVar19 * lVar25 + lVar29) * sVar6;
          lVar36 = (uVar18 * lVar25 + lVar29) * sVar6;
          lVar25 = (lVar25 * uVar21 + lVar29) * sVar6;
          lVar23 = (long)(this->weight_data_tm).w * sVar7;
          pvVar10 = (this->weight_data_tm).data;
          pvVar51 = (void *)(sVar8 * sVar7 * local_158 + (long)pvVar10);
          pvVar31 = (void *)((long)pvVar5 + lVar25);
          local_a8 = (long)pvVar5 + lVar29 * sVar6 + 1;
          local_b0 = (long)pvVar5 + lVar25 + 1;
          pvVar47 = (void *)((long)pvVar5 + lVar36);
          local_b8 = (long)pvVar5 + lVar36 + 1;
          pvVar42 = (void *)((long)pvVar5 + lVar33);
          local_c0 = (long)pvVar5 + lVar33 + 1;
          lVar34 = (this->super_LSTM).weight_hc_data.cstep * local_158;
          sVar6 = (this->super_LSTM).weight_hc_data.elemsize;
          lVar33 = (long)(this->super_LSTM).weight_hc_data.w;
          lVar25 = sVar6 * lVar33;
          lVar29 = (uVar19 * lVar33 + lVar34) * sVar6;
          lVar36 = (uVar18 * lVar33 + lVar34) * sVar6;
          lVar33 = (lVar33 * uVar21 + lVar34) * sVar6;
          pvVar11 = (this->super_LSTM).bias_c_data.data;
          lVar37 = (long)(this->super_LSTM).weight_xc_data_int8_scales.w * local_158 *
                   (this->super_LSTM).weight_xc_data_int8_scales.elemsize;
          pvVar12 = (this->super_LSTM).weight_xc_data_int8_scales.data;
          lVar38 = (long)(this->super_LSTM).weight_hc_data_int8_scales.w * local_158 *
                   (this->super_LSTM).weight_hc_data_int8_scales.elemsize;
          pvVar13 = (this->super_LSTM).weight_hc_data_int8_scales.data;
          pvVar14 = (this->super_LSTM).weight_hc_data.data;
          pvVar5 = (void *)((long)pvVar14 + lVar34 * sVar6);
          local_d0 = (long)pvVar14 + lVar34 * sVar6 + 1;
          local_140 = (void *)((long)pvVar14 + lVar33);
          local_d8 = (long)pvVar14 + lVar33 + 1;
          local_188 = (void *)((long)pvVar14 + lVar36);
          local_e0 = (long)pvVar14 + lVar36 + 1;
          local_190 = (void *)((long)pvVar14 + lVar29);
          local_e8 = (long)pvVar14 + lVar29 + 1;
          pvVar14 = (this->weight_data_tm_int8_descales).data;
          puVar26 = (undefined4 *)
                    ((this->bias_c_data_packed).cstep * local_158 *
                     (this->bias_c_data_packed).elemsize + (long)(this->bias_c_data_packed).data);
          uVar41 = 0;
          pvVar35 = pvVar3;
          local_198 = pvVar5;
          do {
            puVar39 = (undefined1 *)((long)pvVar10 + lVar23 * uVar41 + sVar8 * local_158 * sVar7);
            uVar50 = 0;
            *puVar26 = *(undefined4 *)((long)pvVar11 + uVar41 * 4 + lVar49);
            puVar26[1] = *(undefined4 *)((long)pvVar11 + uVar41 * 4 + lVar22 + lVar49);
            puVar26[2] = *(undefined4 *)((long)pvVar11 + uVar41 * 4 + lVar22 * 2 + lVar49);
            puVar26[3] = *(undefined4 *)((long)pvVar11 + uVar41 * 4 + lVar22 * 3 + lVar49);
            if (0x1f < iVar16) {
              lVar29 = 7;
              do {
                puVar40 = puVar39;
                lVar33 = lVar29 * 4;
                *(undefined8 *)((long)pvVar51 + lVar29 * 4 + -0x1c) =
                     *(undefined8 *)((long)pvVar35 + lVar29 + -7);
                *(undefined8 *)((long)pvVar51 + lVar29 * 4 + -0x14) =
                     *(undefined8 *)((long)pvVar31 + lVar29 + -7);
                *(undefined8 *)((long)pvVar51 + lVar29 * 4 + -0xc) =
                     *(undefined8 *)((long)pvVar47 + lVar29 + -7);
                *(undefined8 *)((long)pvVar51 + lVar29 * 4 + -4) =
                     *(undefined8 *)((long)pvVar42 + lVar29 + -7);
                lVar29 = lVar29 + 8;
                puVar39 = (undefined1 *)((long)pvVar51 + lVar33 + 4);
              } while (lVar29 < iVar48);
              puVar39 = puVar40 + 0x20;
              uVar50 = (int)lVar29 - 7;
            }
            if ((int)(uVar50 | 3) < iVar48) {
              uVar20 = (ulong)uVar50;
              lVar29 = local_a8 + uVar20;
              lVar33 = local_b0 + uVar20;
              lVar36 = local_b8 + uVar20;
              lVar34 = local_c0 + uVar20;
              lVar27 = 0;
              lVar44 = 0;
              do {
                puVar39[lVar44 * 4] = *(undefined1 *)(lVar29 + -1 + lVar44);
                puVar39[lVar44 * 4 + 1] = *(undefined1 *)(lVar29 + lVar44);
                puVar39[lVar44 * 4 + 2] = *(undefined1 *)(lVar29 + 1 + lVar44);
                puVar39[lVar44 * 4 + 3] = *(undefined1 *)(lVar29 + 2 + lVar44);
                puVar39[lVar44 * 4 + 4] = *(undefined1 *)(lVar33 + -1 + lVar44);
                puVar39[lVar44 * 4 + 5] = *(undefined1 *)(lVar33 + lVar44);
                puVar39[lVar44 * 4 + 6] = *(undefined1 *)(lVar33 + 1 + lVar44);
                puVar39[lVar44 * 4 + 7] = *(undefined1 *)(lVar33 + 2 + lVar44);
                puVar39[lVar44 * 4 + 8] = *(undefined1 *)(lVar36 + -1 + lVar44);
                puVar39[lVar44 * 4 + 9] = *(undefined1 *)(lVar36 + lVar44);
                puVar39[lVar44 * 4 + 10] = *(undefined1 *)(lVar36 + 1 + lVar44);
                puVar39[lVar44 * 4 + 0xb] = *(undefined1 *)(lVar36 + 2 + lVar44);
                puVar39[lVar44 * 4 + 0xc] = *(undefined1 *)(lVar34 + -1 + lVar44);
                puVar39[lVar44 * 4 + 0xd] = *(undefined1 *)(lVar34 + lVar44);
                puVar39[lVar44 * 4 + 0xe] = *(undefined1 *)(lVar34 + 1 + lVar44);
                puVar39[lVar44 * 4 + 0xf] = *(undefined1 *)(lVar34 + 2 + lVar44);
                iVar15 = (int)lVar44;
                lVar44 = lVar44 + 4;
                lVar27 = lVar27 + 0x10;
              } while ((int)(uVar50 + iVar15 + 4 | 3) < iVar48);
              uVar50 = uVar50 + (int)lVar44;
              puVar39 = puVar39 + lVar27;
            }
            lVar29 = uVar41 + uVar21;
            lVar33 = uVar41 + uVar18;
            lVar36 = uVar41 + uVar19;
            uVar43 = uVar50 | 1;
            if ((int)uVar43 < iVar48) {
              uVar20 = (ulong)uVar50;
              lVar34 = 0;
              puVar40 = puVar39;
              do {
                puVar24 = puVar40;
                puVar40 = puVar39 + lVar34 * 4;
                *puVar40 = *(undefined1 *)((long)pvVar35 + lVar34 + uVar20);
                uVar45 = (ulong)uVar43;
                puVar40[1] = *(undefined1 *)((long)pvVar3 + uVar45 + uVar41 * lVar32);
                puVar40[2] = *(undefined1 *)((long)pvVar31 + lVar34 + uVar20);
                puVar40[3] = *(undefined1 *)((long)pvVar3 + uVar45 + lVar29 * lVar32);
                puVar40[4] = *(undefined1 *)((long)pvVar47 + lVar34 + uVar20);
                puVar40[5] = *(undefined1 *)((long)pvVar3 + uVar45 + lVar33 * lVar32);
                puVar40[6] = *(undefined1 *)((long)pvVar42 + lVar34 + uVar20);
                puVar40[7] = *(undefined1 *)((long)pvVar3 + uVar45 + lVar36 * lVar32);
                uVar43 = uVar50 + (int)lVar34 + 2 | 1;
                lVar34 = lVar34 + 2;
                puVar40 = puVar40 + 8;
              } while ((int)uVar43 < iVar48);
              puVar39 = puVar24 + 8;
              uVar50 = uVar50 + (int)lVar34;
            }
            if ((int)uVar50 < iVar48) {
              uVar20 = (ulong)uVar50;
              lVar34 = 0;
              puVar40 = puVar39;
              do {
                puVar24 = puVar40;
                puVar40 = puVar39 + lVar34 * 4;
                *puVar40 = *(undefined1 *)((long)pvVar35 + lVar34 + uVar20);
                puVar40[1] = *(undefined1 *)((long)pvVar31 + lVar34 + uVar20);
                puVar40[2] = *(undefined1 *)((long)pvVar47 + lVar34 + uVar20);
                puVar40[3] = *(undefined1 *)((long)pvVar42 + lVar34 + uVar20);
                lVar34 = lVar34 + 1;
                puVar40 = puVar40 + 4;
              } while ((int)((int)lVar34 + uVar50) < iVar48);
              puVar39 = puVar24 + 4;
            }
            uVar20 = 0;
            if (7 < num_output) {
              lVar34 = 7;
              puVar40 = puVar39;
              do {
                puVar24 = puVar40;
                lVar27 = lVar34 * 4;
                *(undefined8 *)(puVar39 + lVar34 * 4 + -0x1c) =
                     *(undefined8 *)((long)local_198 + lVar34 + -7);
                *(undefined8 *)(puVar39 + lVar34 * 4 + -0x14) =
                     *(undefined8 *)((long)local_140 + lVar34 + -7);
                *(undefined8 *)(puVar39 + lVar34 * 4 + -0xc) =
                     *(undefined8 *)((long)local_188 + lVar34 + -7);
                *(undefined8 *)(puVar39 + lVar34 * 4 + -4) =
                     *(undefined8 *)((long)local_190 + lVar34 + -7);
                lVar34 = lVar34 + 8;
                puVar40 = puVar39 + lVar27 + 4;
              } while (lVar34 < num_output);
              puVar39 = puVar24 + 0x20;
              uVar20 = (ulong)((int)lVar34 - 7);
            }
            uVar50 = (uint)uVar20;
            if ((int)(uVar50 | 3) < num_output) {
              lVar34 = local_d0 + uVar20;
              lVar27 = local_d8 + uVar20;
              lVar44 = local_e0 + uVar20;
              lVar1 = local_e8 + uVar20;
              lVar28 = 0;
              lVar46 = 0;
              do {
                puVar39[lVar46 * 4] = *(undefined1 *)(lVar34 + -1 + lVar46);
                puVar39[lVar46 * 4 + 1] = *(undefined1 *)(lVar34 + lVar46);
                puVar39[lVar46 * 4 + 2] = *(undefined1 *)(lVar34 + 1 + lVar46);
                puVar39[lVar46 * 4 + 3] = *(undefined1 *)(lVar34 + 2 + lVar46);
                puVar39[lVar46 * 4 + 4] = *(undefined1 *)(lVar27 + -1 + lVar46);
                puVar39[lVar46 * 4 + 5] = *(undefined1 *)(lVar27 + lVar46);
                puVar39[lVar46 * 4 + 6] = *(undefined1 *)(lVar27 + 1 + lVar46);
                puVar39[lVar46 * 4 + 7] = *(undefined1 *)(lVar27 + 2 + lVar46);
                puVar39[lVar46 * 4 + 8] = *(undefined1 *)(lVar44 + -1 + lVar46);
                puVar39[lVar46 * 4 + 9] = *(undefined1 *)(lVar44 + lVar46);
                puVar39[lVar46 * 4 + 10] = *(undefined1 *)(lVar44 + 1 + lVar46);
                puVar39[lVar46 * 4 + 0xb] = *(undefined1 *)(lVar44 + 2 + lVar46);
                puVar39[lVar46 * 4 + 0xc] = *(undefined1 *)(lVar1 + -1 + lVar46);
                puVar39[lVar46 * 4 + 0xd] = *(undefined1 *)(lVar1 + lVar46);
                puVar39[lVar46 * 4 + 0xe] = *(undefined1 *)(lVar1 + 1 + lVar46);
                puVar39[lVar46 * 4 + 0xf] = *(undefined1 *)(lVar1 + 2 + lVar46);
                iVar15 = (int)lVar46;
                lVar46 = lVar46 + 4;
                lVar28 = lVar28 + 0x10;
              } while ((int)(uVar50 + iVar15 + 4 | 3) < num_output);
              uVar20 = (ulong)(uVar50 + (int)lVar46);
              puVar39 = puVar39 + lVar28;
            }
            uVar50 = (uint)uVar20;
            uVar43 = uVar50 | 1;
            if ((int)uVar43 < num_output) {
              lVar34 = 0;
              puVar40 = puVar39;
              do {
                puVar24 = puVar40;
                puVar40 = puVar39 + lVar34 * 4;
                *puVar40 = *(undefined1 *)((long)local_198 + lVar34 + uVar20);
                uVar45 = (ulong)uVar43;
                puVar40[1] = *(undefined1 *)((long)pvVar5 + uVar45 + uVar41 * lVar25);
                puVar40[2] = *(undefined1 *)((long)local_140 + lVar34 + uVar20);
                puVar40[3] = *(undefined1 *)((long)pvVar5 + uVar45 + lVar29 * lVar25);
                puVar40[4] = *(undefined1 *)((long)local_188 + lVar34 + uVar20);
                puVar40[5] = *(undefined1 *)((long)pvVar5 + uVar45 + lVar33 * lVar25);
                puVar40[6] = *(undefined1 *)((long)local_190 + lVar34 + uVar20);
                puVar40[7] = *(undefined1 *)((long)pvVar5 + uVar45 + lVar36 * lVar25);
                uVar43 = uVar50 + (int)lVar34 + 2 | 1;
                lVar34 = lVar34 + 2;
                puVar40 = puVar40 + 8;
              } while ((int)uVar43 < num_output);
              puVar39 = puVar24 + 8;
              uVar20 = (ulong)(uVar50 + (int)lVar34);
            }
            if ((int)uVar20 < num_output) {
              lVar34 = 0;
              do {
                puVar39[lVar34 * 4] = *(undefined1 *)((long)local_198 + lVar34 + uVar20);
                puVar39[lVar34 * 4 + 1] = *(undefined1 *)((long)local_140 + lVar34 + uVar20);
                puVar39[lVar34 * 4 + 2] = *(undefined1 *)((long)local_188 + lVar34 + uVar20);
                puVar39[lVar34 * 4 + 3] = *(undefined1 *)((long)local_190 + lVar34 + uVar20);
                lVar34 = lVar34 + 1;
              } while ((int)lVar34 + (int)uVar20 < num_output);
            }
            lVar34 = (long)iVar17 * sVar9 * uVar41;
            *(float *)((long)pvVar14 + lVar34 + lVar30) =
                 1.0 / *(float *)((long)pvVar12 + uVar41 * 4 + lVar37);
            *(float *)((long)pvVar14 + lVar34 + lVar30 + 4) =
                 1.0 / *(float *)((long)pvVar12 + lVar29 * 4 + lVar37);
            *(float *)((long)pvVar14 + lVar34 + lVar30 + 8) =
                 1.0 / *(float *)((long)pvVar12 + lVar33 * 4 + lVar37);
            *(float *)((long)pvVar14 + lVar34 + lVar30 + 0xc) =
                 1.0 / *(float *)((long)pvVar12 + lVar36 * 4 + lVar37);
            *(float *)((long)pvVar14 + lVar34 + lVar30 + 0x10) =
                 1.0 / *(float *)((long)pvVar13 + uVar41 * 4 + lVar38);
            *(float *)((long)pvVar14 + lVar34 + lVar30 + 0x14) =
                 1.0 / *(float *)((long)pvVar13 + lVar29 * 4 + lVar38);
            *(float *)((long)pvVar14 + lVar34 + lVar30 + 0x18) =
                 1.0 / *(float *)((long)pvVar13 + lVar33 * 4 + lVar38);
            *(float *)((long)pvVar14 + lVar34 + lVar30 + 0x1c) =
                 1.0 / *(float *)((long)pvVar13 + lVar36 * 4 + lVar38);
            puVar26 = puVar26 + 4;
            uVar41 = uVar41 + 1;
            pvVar42 = (void *)((long)pvVar42 + lVar32);
            pvVar47 = (void *)((long)pvVar47 + lVar32);
            pvVar31 = (void *)((long)pvVar31 + lVar32);
            pvVar35 = (void *)((long)pvVar35 + lVar32);
            pvVar51 = (void *)((long)pvVar51 + lVar23);
            local_a8 = local_a8 + lVar32;
            local_b0 = local_b0 + lVar32;
            local_b8 = local_b8 + lVar32;
            local_c0 = local_c0 + lVar32;
            local_190 = (void *)((long)local_190 + lVar25);
            local_188 = (void *)((long)local_188 + lVar25);
            local_140 = (void *)((long)local_140 + lVar25);
            local_198 = (void *)((long)local_198 + lVar25);
            local_d0 = local_d0 + lVar25;
            local_d8 = local_d8 + lVar25;
            local_e0 = local_e0 + lVar25;
            local_e8 = local_e8 + lVar25;
          } while (uVar41 != uVar21);
        }
        local_158 = local_158 + 1;
      } while (local_158 != _c);
    }
    else {
      lstm_transform_weight_int8_avx2
                (weight_xc,weight_xc_int8_scales,weight_hc,weight_hc_int8_scales,bias_c,this_00,
                 this_01,this_02,iVar48,num_output,_c,_h,opt);
    }
  }
  else {
    lstm_transform_weight_int8_avxvnni
              (weight_xc,weight_xc_int8_scales,weight_hc,weight_hc_int8_scales,bias_c,this_00,
               this_01,this_02,iVar48,num_output,_c,_h,opt);
  }
  if (opt->lightmode == true) {
    piVar2 = (this->super_LSTM).weight_xc_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->super_LSTM).weight_xc_data.data;
        pAVar4 = (this->super_LSTM).weight_xc_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data.elemsize + 4) = 0;
    weight_xc->data = (void *)0x0;
    (this->super_LSTM).weight_xc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data.dims = 0;
    (this->super_LSTM).weight_xc_data.w = 0;
    (this->super_LSTM).weight_xc_data.h = 0;
    (this->super_LSTM).weight_xc_data.d = 0;
    (this->super_LSTM).weight_xc_data.c = 0;
    piVar2 = (this->super_LSTM).bias_c_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->super_LSTM).bias_c_data.data;
        pAVar4 = (this->super_LSTM).bias_c_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).bias_c_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).bias_c_data.elemsize + 4) = 0;
    bias_c->data = (void *)0x0;
    (this->super_LSTM).bias_c_data.refcount = (int *)0x0;
    (this->super_LSTM).bias_c_data.dims = 0;
    (this->super_LSTM).bias_c_data.w = 0;
    (this->super_LSTM).bias_c_data.h = 0;
    (this->super_LSTM).bias_c_data.d = 0;
    (this->super_LSTM).bias_c_data.c = 0;
    piVar2 = (this->super_LSTM).weight_hc_data.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->super_LSTM).weight_hc_data.data;
        pAVar4 = (this->super_LSTM).weight_hc_data.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data.elemsize + 4) = 0;
    weight_hc->data = (void *)0x0;
    (this->super_LSTM).weight_hc_data.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data.dims = 0;
    (this->super_LSTM).weight_hc_data.w = 0;
    (this->super_LSTM).weight_hc_data.h = 0;
    (this->super_LSTM).weight_hc_data.d = 0;
    (this->super_LSTM).weight_hc_data.c = 0;
    piVar2 = (this->super_LSTM).weight_xc_data_int8_scales.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->super_LSTM).weight_xc_data_int8_scales.data;
        pAVar4 = (this->super_LSTM).weight_xc_data_int8_scales.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_xc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_xc_data_int8_scales.elemsize + 4) = 0;
    weight_xc_int8_scales->data = (void *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_xc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.d = 0;
    (this->super_LSTM).weight_xc_data_int8_scales.c = 0;
    piVar2 = (this->super_LSTM).weight_hc_data_int8_scales.refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->super_LSTM).weight_hc_data_int8_scales.data;
        pAVar4 = (this->super_LSTM).weight_hc_data_int8_scales.allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (*pAVar4->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_LSTM).weight_hc_data_int8_scales.cstep = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_LSTM).weight_hc_data_int8_scales.elemsize + 4) = 0;
    weight_hc_int8_scales->data = (void *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.refcount = (int *)0x0;
    (this->super_LSTM).weight_hc_data_int8_scales.dims = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.w = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.h = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.d = 0;
    (this->super_LSTM).weight_hc_data_int8_scales.c = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86_avx::create_pipeline_int8(const Option& opt)
{
    // pack IFOG
    const int num_directions = direction == 2 ? 2 : 1;
    const int size = weight_data_size / num_directions / hidden_size / 4;

    lstm_transform_weight_int8(weight_xc_data, weight_xc_data_int8_scales, weight_hc_data, weight_hc_data_int8_scales, bias_c_data, weight_data_tm, weight_data_tm_int8_descales, bias_c_data_packed, size, num_output, num_directions, hidden_size, opt);

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
        weight_xc_data_int8_scales.release();
        weight_hc_data_int8_scales.release();
    }

    return 0;
}